

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O1

void ImGui_ImplGlfw_NewFrame(void)

{
  ImFontAtlas *pIVar1;
  double dVar2;
  int iVar3;
  ImGuiMouseCursor IVar4;
  ImGuiIO *pIVar5;
  float *pfVar6;
  uchar *puVar7;
  GLFWcursor *cursorHandle;
  int i;
  long lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  int display_h;
  int display_w;
  double mouse_x;
  int buttons_count;
  int h;
  int w;
  int local_38;
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  int local_1c;
  
  pIVar5 = ImGui::GetIO();
  pIVar1 = pIVar5->Fonts;
  if ((0 < (pIVar1->Fonts).Size) &&
     ((pIVar1->TexPixelsAlpha8 != (uchar *)0x0 || (pIVar1->TexPixelsRGBA32 != (uint *)0x0)))) {
    glfwGetWindowSize(g_Window,&local_1c,&local_20);
    glfwGetFramebufferSize(g_Window,&local_34,&local_38);
    (pIVar5->DisplaySize).x = (float)local_1c;
    (pIVar5->DisplaySize).y = (float)local_20;
    if (0 < local_20 && 0 < local_1c) {
      (pIVar5->DisplayFramebufferScale).x = (float)local_34 / (float)local_1c;
      (pIVar5->DisplayFramebufferScale).y = (float)local_38 / (float)local_20;
    }
    dVar2 = glfwGetTime();
    if (0.0 < g_Time) {
      fVar11 = (float)(dVar2 - g_Time);
    }
    else {
      fVar11 = 0.016666668;
    }
    pIVar5->DeltaTime = fVar11;
    lVar8 = 0;
    g_Time = dVar2;
    pIVar5 = ImGui::GetIO();
    do {
      bVar9 = true;
      if (g_MouseJustPressed[lVar8] == false) {
        iVar3 = glfwGetMouseButton(g_Window,(int)lVar8);
        bVar9 = iVar3 != 0;
      }
      pIVar5->MouseDown[lVar8] = bVar9;
      g_MouseJustPressed[lVar8] = false;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    fVar11 = (pIVar5->MousePos).x;
    fVar10 = (pIVar5->MousePos).y;
    (pIVar5->MousePos).x = -3.4028235e+38;
    (pIVar5->MousePos).y = -3.4028235e+38;
    iVar3 = glfwGetWindowAttrib(g_Window,0x20001);
    if (iVar3 != 0) {
      if (pIVar5->WantSetMousePos == true) {
        glfwSetCursorPos(g_Window,(double)fVar11,(double)fVar10);
      }
      else {
        glfwGetCursorPos(g_Window,(double *)&local_30,(double *)&local_28);
        (pIVar5->MousePos).x = (float)(double)CONCAT44(local_30._4_4_,(int)local_30);
        (pIVar5->MousePos).y = (float)(double)CONCAT44(local_28._4_4_,(int)local_28);
      }
    }
    pIVar5 = ImGui::GetIO();
    if ((pIVar5->ConfigFlags & 0x20) == 0) {
      iVar3 = glfwGetInputMode(g_Window,0x33001);
      if (iVar3 != 0x34003) {
        IVar4 = ImGui::GetMouseCursor();
        iVar3 = 0x34002;
        if ((IVar4 != -1) && (pIVar5->MouseDrawCursor == false)) {
          cursorHandle = g_MouseCursors[IVar4];
          if (g_MouseCursors[IVar4] == (GLFWcursor *)0x0) {
            cursorHandle = g_MouseCursors[0];
          }
          glfwSetCursor(g_Window,cursorHandle);
          iVar3 = 0x34001;
        }
        glfwSetInputMode(g_Window,0x33001,iVar3);
      }
    }
    pIVar5 = ImGui::GetIO();
    pIVar5->NavInputs[0] = 0.0;
    pIVar5->NavInputs[1] = 0.0;
    pIVar5->NavInputs[2] = 0.0;
    pIVar5->NavInputs[3] = 0.0;
    pIVar5->NavInputs[4] = 0.0;
    pIVar5->NavInputs[5] = 0.0;
    pIVar5->NavInputs[6] = 0.0;
    pIVar5->NavInputs[7] = 0.0;
    pIVar5->NavInputs[8] = 0.0;
    pIVar5->NavInputs[9] = 0.0;
    pIVar5->NavInputs[10] = 0.0;
    pIVar5->NavInputs[0xb] = 0.0;
    pIVar5->NavInputs[0xc] = 0.0;
    pIVar5->NavInputs[0xd] = 0.0;
    pIVar5->NavInputs[0xe] = 0.0;
    pIVar5->NavInputs[0xf] = 0.0;
    pIVar5->NavInputs[0x10] = 0.0;
    pIVar5->NavInputs[0x11] = 0.0;
    pIVar5->NavInputs[0x12] = 0.0;
    pIVar5->NavInputs[0x13] = 0.0;
    pIVar5->NavInputs[0x14] = 0.0;
    if ((pIVar5->ConfigFlags & 2) != 0) {
      local_30._0_4_ = 0;
      local_28._0_4_ = 0;
      pfVar6 = glfwGetJoystickAxes(0,(int *)&local_30);
      puVar7 = glfwGetJoystickButtons(0,(int *)&local_28);
      if ((0 < (int)local_28) && (*puVar7 == '\x01')) {
        pIVar5->NavInputs[0] = 1.0;
      }
      if ((1 < (int)local_28) && (puVar7[1] == '\x01')) {
        pIVar5->NavInputs[1] = 1.0;
      }
      if ((2 < (int)local_28) && (puVar7[2] == '\x01')) {
        pIVar5->NavInputs[3] = 1.0;
      }
      if ((3 < (int)local_28) && (puVar7[3] == '\x01')) {
        pIVar5->NavInputs[2] = 1.0;
      }
      if ((0xd < (int)local_28) && (puVar7[0xd] == '\x01')) {
        pIVar5->NavInputs[4] = 1.0;
      }
      if ((0xb < (int)local_28) && (puVar7[0xb] == '\x01')) {
        pIVar5->NavInputs[5] = 1.0;
      }
      if ((10 < (int)local_28) && (puVar7[10] == '\x01')) {
        pIVar5->NavInputs[6] = 1.0;
      }
      if ((0xc < (int)local_28) && (puVar7[0xc] == '\x01')) {
        pIVar5->NavInputs[7] = 1.0;
      }
      if ((4 < (int)local_28) && (puVar7[4] == '\x01')) {
        pIVar5->NavInputs[0xc] = 1.0;
      }
      if ((5 < (int)local_28) && (puVar7[5] == '\x01')) {
        pIVar5->NavInputs[0xd] = 1.0;
      }
      if ((4 < (int)local_28) && (puVar7[4] == '\x01')) {
        pIVar5->NavInputs[0xe] = 1.0;
      }
      if ((5 < (int)local_28) && (puVar7[5] == '\x01')) {
        pIVar5->NavInputs[0xf] = 1.0;
      }
      if ((int)local_30 < 1) {
        fVar11 = 0.0;
      }
      else {
        fVar11 = *pfVar6 + 0.3;
      }
      fVar10 = 1.0;
      if (fVar11 / -0.59999996 <= 1.0) {
        fVar10 = fVar11 / -0.59999996;
      }
      if (pIVar5->NavInputs[8] <= fVar10 && fVar10 != pIVar5->NavInputs[8]) {
        pIVar5->NavInputs[8] = fVar10;
      }
      if ((int)local_30 < 1) {
        fVar11 = 0.0;
      }
      else {
        fVar11 = *pfVar6 + -0.3;
      }
      fVar10 = 1.0;
      if (fVar11 / 0.59999996 <= 1.0) {
        fVar10 = fVar11 / 0.59999996;
      }
      if (pIVar5->NavInputs[9] <= fVar10 && fVar10 != pIVar5->NavInputs[9]) {
        pIVar5->NavInputs[9] = fVar10;
      }
      fVar11 = 0.0;
      if (1 < (int)local_30) {
        fVar11 = pfVar6[1] + -0.3;
      }
      fVar10 = 1.0;
      if (fVar11 / 0.59999996 <= 1.0) {
        fVar10 = fVar11 / 0.59999996;
      }
      if (pIVar5->NavInputs[10] <= fVar10 && fVar10 != pIVar5->NavInputs[10]) {
        pIVar5->NavInputs[10] = fVar10;
      }
      fVar11 = 0.0;
      if (1 < (int)local_30) {
        fVar11 = pfVar6[1] + 0.3;
      }
      fVar10 = 1.0;
      if (fVar11 / -0.59999996 <= 1.0) {
        fVar10 = fVar11 / -0.59999996;
      }
      if (pIVar5->NavInputs[0xb] <= fVar10 && fVar10 != pIVar5->NavInputs[0xb]) {
        pIVar5->NavInputs[0xb] = fVar10;
      }
      pIVar5->BackendFlags =
           (uint)(0 < (int)local_28 && 0 < (int)local_30) | pIVar5->BackendFlags & 0xfffffffeU;
    }
    return;
  }
  __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/ApiDebug/imgui_impl.cpp"
                ,0x144,"void ImGui_ImplGlfw_NewFrame()");
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    ImGui_ImplGlfw_UpdateMousePosAndButtons();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplGlfw_UpdateGamepads();
}